

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O0

void __thiscall
cmState::AddDisallowedCommand
          (cmState *this,string *name,cmCommand *command,PolicyID policy,char *message)

{
  cmDisallowedCommand *this_00;
  char *message_local;
  PolicyID policy_local;
  cmCommand *command_local;
  string *name_local;
  cmState *this_local;
  
  this_00 = (cmDisallowedCommand *)operator_new(0x48);
  cmDisallowedCommand::cmDisallowedCommand(this_00,command,policy,message);
  AddBuiltinCommand(this,name,(cmCommand *)this_00);
  return;
}

Assistant:

void cmState::AddDisallowedCommand(std::string const& name, cmCommand* command,
                                   cmPolicies::PolicyID policy,
                                   const char* message)
{
  this->AddBuiltinCommand(name,
                          new cmDisallowedCommand(command, policy, message));
}